

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O2

t_int * sigvcf_perform(t_int *w)

{
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  t_bigorsmall32 pun_1;
  float fVar13;
  t_bigorsmall32 pun;
  float fVar14;
  float fVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pfVar7 = cos_table;
  lVar2 = w[1];
  lVar3 = w[2];
  lVar4 = w[3];
  lVar5 = w[4];
  pfVar6 = (float *)w[5];
  fVar21 = *pfVar6;
  fVar19 = pfVar6[1];
  fVar13 = pfVar6[2];
  fVar1 = pfVar6[3];
  fVar14 = (float)(-(uint)(0.0 < fVar13) & (uint)(1.0 / fVar13));
  lVar9 = 0;
  iVar8 = (int)w[6];
  if ((int)w[6] < 1) {
    iVar8 = 0;
  }
  for (; iVar8 != (int)lVar9; lVar9 = lVar9 + 1) {
    fVar15 = *(float *)(lVar3 + lVar9 * 4) * fVar1;
    fVar20 = 0.0;
    if (0.0 <= fVar15) {
      fVar20 = fVar15;
    }
    fVar17 = (float)((uint)(1.0 - fVar20 * fVar14) & -(uint)(0.0 < fVar14));
    fVar15 = 0.0;
    if (0.0 <= fVar17) {
      fVar15 = fVar17;
    }
    dVar16 = (double)(fVar20 * 81.4874) + 1572864.0;
    uVar11 = (uint)((ulong)dVar16 >> 0x20);
    uVar10 = (ulong)(uVar11 & 0x1ff);
    fVar20 = (float)((double)((ulong)dVar16 & 0xffffffff | 0x4138000000000000) + -1572864.0);
    uVar12 = (ulong)(uVar11 + 0x180 & 0x1ff);
    fVar17 = ((pfVar7[uVar12 + 1] - pfVar7[uVar12]) * fVar20 + pfVar7[uVar12]) * fVar15;
    fVar18 = fVar17 * fVar21;
    fVar20 = ((pfVar7[uVar10 + 1] - pfVar7[uVar10]) * fVar20 + pfVar7[uVar10]) * fVar15;
    fVar21 = ((1.0 - fVar15) * (2.0 - 2.0 / (fVar13 + 2.0)) * *(float *)(lVar2 + lVar9 * 4) +
             fVar21 * fVar20) - fVar17 * fVar19;
    *(float *)(lVar4 + lVar9 * 4) = fVar21;
    fVar19 = fVar18 + fVar20 * fVar19;
    *(float *)(lVar5 + lVar9 * 4) = fVar19;
  }
  fVar13 = 0.0;
  if ((((uint)fVar21 >> 0x1d ^ (uint)fVar21 >> 0x1e) & 1) != 0) {
    fVar13 = fVar21;
  }
  fVar21 = 0.0;
  if ((((uint)fVar19 >> 0x1d ^ (uint)fVar19 >> 0x1e) & 1) != 0) {
    fVar21 = fVar19;
  }
  *pfVar6 = fVar13;
  pfVar6[1] = fVar21;
  return w + 7;
}

Assistant:

static t_int *sigvcf_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out1 = (t_sample *)(w[3]);
    t_sample *out2 = (t_sample *)(w[4]);
    t_vcfctl *c = (t_vcfctl *)(w[5]);
    int n = (int)w[6];
    int i;
    t_float re = c->c_re, re2;
    t_float im = c->c_im;
    t_float q = c->c_q;
    t_float isr = c->c_isr;
    t_float qinv = (q > 0? 1.0f/q : 0);
    t_float ampcorrect = 2. - 2. / (q + 2.);
    t_float coefr, coefi;
    float *tab = cos_table, *addr, f1, f2, frac;
    double dphase;
    int normhipart, tabindex;
    union tabfudge tf;

    tf.tf_d = UNITBIT32;
    normhipart = tf.tf_i[HIOFFSET];

    for (i = 0; i < n; i++)
    {
        float cf, cfindx, r, oneminusr;
        cf = *in2++ * isr;
        if (cf < 0) cf = 0;
        cfindx = cf * (float)(COSTABSIZE/6.28318f);
        r = (qinv > 0 ? 1 - cf * qinv : 0);
        if (r < 0) r = 0;
        oneminusr = 1.0f - r;
        dphase = ((double)(cfindx)) + UNITBIT32;
        tf.tf_d = dphase;
        tabindex = tf.tf_i[HIOFFSET] & (COSTABSIZE-1);
        addr = tab + tabindex;
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
        f1 = addr[0];
        f2 = addr[1];
        coefr = r * (f1 + frac * (f2 - f1));

        addr = tab + ((tabindex - (COSTABSIZE/4)) & (COSTABSIZE-1));
        f1 = addr[0];
        f2 = addr[1];
        coefi = r * (f1 + frac * (f2 - f1));

        f1 = *in1++;
        re2 = re;
        *out1++ = re = ampcorrect * oneminusr * f1
            + coefr * re2 - coefi * im;
        *out2++ = im = coefi * re2 + coefr * im;
    }
    if (PD_BIGORSMALL(re))
        re = 0;
    if (PD_BIGORSMALL(im))
        im = 0;
    c->c_re = re;
    c->c_im = im;
    return (w+7);
}